

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,int32_t start,int32_t length,char *target,int32_t targetCapacity,
          EInvariant param_5)

{
  char16_t *pcVar1;
  UErrorCode local_34;
  EInvariant local_30;
  UErrorCode status;
  EInvariant param_5_local;
  int32_t targetCapacity_local;
  char *target_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  if ((targetCapacity < 0) || ((0 < targetCapacity && (target == (char *)0x0)))) {
    this_local._4_4_ = 0;
  }
  else {
    local_30 = param_5;
    status = targetCapacity;
    _param_5_local = target;
    target_local._0_4_ = length;
    target_local._4_4_ = start;
    _length_local = this;
    pinIndices(this,(int32_t *)((long)&target_local + 4),(int32_t *)&target_local);
    if ((UErrorCode)target_local <= status) {
      pcVar1 = getArrayStart(this);
      u_UCharsToChars_63(pcVar1 + target_local._4_4_,_param_5_local,(UErrorCode)target_local);
    }
    local_34 = U_ZERO_ERROR;
    this_local._4_4_ = u_terminateChars_63(_param_5_local,status,(UErrorCode)target_local,&local_34)
    ;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UnicodeString::extract(int32_t start,
                       int32_t length,
                       char *target,
                       int32_t targetCapacity,
                       enum EInvariant) const
{
  // if the arguments are illegal, then do nothing
  if(targetCapacity < 0 || (targetCapacity > 0 && target == NULL)) {
    return 0;
  }

  // pin the indices to legal values
  pinIndices(start, length);

  if(length <= targetCapacity) {
    u_UCharsToChars(getArrayStart() + start, target, length);
  }
  UErrorCode status = U_ZERO_ERROR;
  return u_terminateChars(target, targetCapacity, length, &status);
}